

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O3

void __thiscall Am_Object_Data::~Am_Object_Data(Am_Object_Data *this)

{
  uint *puVar1;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e27f8;
  puVar1 = &(this->super_Am_Wrapper).refs;
  *puVar1 = *puVar1 + 1;
  if ((this->data).data != (char *)0x0) {
    destroy_object(this);
  }
  (this->part_slot).super_Am_Value.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value::~Am_Value(&(this->part_slot).super_Am_Value);
  Am_Value::~Am_Value(&(this->owner_slot).super_Am_Value);
  Am_Demon_Queue::~Am_Demon_Queue(&this->demon_queue);
  return;
}

Assistant:

Am_Object_Data::~Am_Object_Data()
{
// all special debug actions have to take place before we delete
// anything from this object !!
#ifdef DEBUG
  const char *name = Am_Get_Name_Of_Item(this);

#ifdef LEAK_TRACE
  if (name != nullptr) {
    std::cout << name << "\t\tdestroyed: " << this
              << "\tReferences: " << Ref_Count() << std::endl;
  } else {
    std::cout << "NO-LONGER-NAMED\t\tdestroyed: " << this
              << "\tReferences: " << Ref_Count() << std::endl;
  }
#endif

  Am_Unregister_Name(this);
  delete[] name;
#endif

  Note_Reference();

  if (data.data) {
    destroy_object();
  }

  part_slot.value.wrapper_value = nullptr;
}